

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_node_struct *node;
  xml_node_struct *pxVar1;
  xml_node_struct *sn_00;
  xml_node_struct *in_RSI;
  xml_node_struct *in_RDI;
  xml_node_struct *copy;
  xml_node_struct *sit;
  xml_node_struct *dit;
  xml_allocator *shared_alloc;
  xml_allocator *alloc;
  xml_node_type in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  xml_node_struct *shared_alloc_00;
  xml_node_struct *in_stack_ffffffffffffffc8;
  xml_node_struct *in_stack_ffffffffffffffd0;
  
  node = (xml_node_struct *)get_allocator<pugi::xml_node_struct>(in_RDI);
  shared_alloc_00 = node;
  pxVar1 = (xml_node_struct *)get_allocator<pugi::xml_node_struct>(in_RSI);
  if (shared_alloc_00 != pxVar1) {
    node = (xml_node_struct *)0x0;
  }
  node_copy_contents(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (xml_allocator *)shared_alloc_00);
  pxVar1 = in_RSI->first_child;
  do {
    while( true ) {
      if (pxVar1 == (xml_node_struct *)0x0 || pxVar1 == in_RSI) {
        return;
      }
      if (((pxVar1 == in_RDI) ||
          (sn_00 = append_new_node(node,(xml_allocator *)
                                        CONCAT17(pxVar1 != (xml_node_struct *)0x0 &&
                                                 pxVar1 != in_RSI,in_stack_ffffffffffffffb0),
                                   in_stack_ffffffffffffffac), sn_00 == (xml_node_struct *)0x0)) ||
         (node_copy_contents(pxVar1,sn_00,(xml_allocator *)shared_alloc_00),
         pxVar1->first_child == (xml_node_struct *)0x0)) break;
      pxVar1 = pxVar1->first_child;
    }
    do {
      if (pxVar1->next_sibling != (xml_node_struct *)0x0) {
        pxVar1 = pxVar1->next_sibling;
        break;
      }
      pxVar1 = pxVar1->parent;
    } while (pxVar1 != in_RSI);
  } while( true );
}

Assistant:

PUGI_IMPL_FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : NULL;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// loop invariant: dit is inside the subtree rooted at dn
			assert(dit);

			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI_IMPL_NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;

				// loop invariant: dit is inside the subtree rooted at dn while sit is inside sn
				assert(sit == sn || dit);
			}
			while (sit != sn);
		}

		assert(!sit || dit == dn->parent);
	}